

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

pool_ptr<soul::AST::Expression> __thiscall
soul::StructuralParser::tryParsingType(StructuralParser *this,ParseTypeContext parseContext)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  Op op;
  ConcreteType *pCVar4;
  Expression *pEVar5;
  TypeMetaFunction *pTVar6;
  QualifiedIdentifier *qi;
  ParseTypeContext in_EDX;
  undefined4 in_register_00000034;
  StructuralParser *this_00;
  char (*in_R9) [25];
  Context context;
  Context local_1d0;
  Type local_1b8;
  Type local_1a0;
  Type local_188;
  Type local_170;
  Type local_158;
  Type local_140;
  Type local_128;
  Type local_110;
  Type local_f8;
  Type local_e0;
  Type local_c8;
  Type local_b0;
  CompileMessage local_98;
  CompileMessage local_60;
  
  this_00 = (StructuralParser *)CONCAT44(in_register_00000034,parseContext);
  local_1d0.location.sourceCode.object = (this_00->super_SOULTokeniser).location.sourceCode.object;
  if (local_1d0.location.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_1d0.location.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_1d0.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_1d0.location.location.data = (this_00->super_SOULTokeniser).location.location.data;
  local_1d0.parentScope = this_00->currentScope;
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>
                    ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      *)this_00,(TokenType)0x289283);
  if (bVar2) {
    local_b0.category = primitive;
    local_b0.arrayElementCategory = invalid;
    local_b0.isRef = false;
    local_b0.isConstant = false;
    local_b0.primitiveType.type = float32;
    local_b0.boundingSize = 0;
    local_b0.arrayElementBoundingSize = 0;
    local_b0.structure.object = (Structure *)0x0;
    pCVar4 = PoolAllocator::allocate<soul::AST::ConcreteType,soul::AST::Context_const&,soul::Type>
                       (&this_00->allocator->pool,&local_1d0,&local_b0);
    pEVar5 = parseVectorOrArrayTypeSuffixes(this_00,&pCVar4->super_Expression,in_EDX);
    (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)pEVar5;
    RefCountedPtr<soul::Structure>::decIfNotNull(local_b0.structure.object);
    goto LAB_001f9813;
  }
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>
                    ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      *)this_00,(TokenType)0x2899f5);
  if (bVar2) {
    local_c8.category = primitive;
    local_c8.arrayElementCategory = invalid;
    local_c8.isRef = false;
    local_c8.isConstant = false;
    local_c8.primitiveType.type = float32;
    local_c8.boundingSize = 0;
    local_c8.arrayElementBoundingSize = 0;
    local_c8.structure.object = (Structure *)0x0;
    pCVar4 = PoolAllocator::allocate<soul::AST::ConcreteType,soul::AST::Context_const&,soul::Type>
                       (&this_00->allocator->pool,&local_1d0,&local_c8);
    pEVar5 = parseVectorOrArrayTypeSuffixes(this_00,&pCVar4->super_Expression,in_EDX);
    (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)pEVar5;
    RefCountedPtr<soul::Structure>::decIfNotNull(local_c8.structure.object);
    goto LAB_001f9813;
  }
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>
                    ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      *)this_00,(TokenType)0x289a0c);
  if (bVar2) {
    local_e0.category = primitive;
    local_e0.arrayElementCategory = invalid;
    local_e0.isRef = false;
    local_e0.isConstant = false;
    local_e0.primitiveType.type = float64;
    local_e0.boundingSize = 0;
    local_e0.arrayElementBoundingSize = 0;
    local_e0.structure.object = (Structure *)0x0;
    pCVar4 = PoolAllocator::allocate<soul::AST::ConcreteType,soul::AST::Context_const&,soul::Type>
                       (&this_00->allocator->pool,&local_1d0,&local_e0);
    pEVar5 = parseVectorOrArrayTypeSuffixes(this_00,&pCVar4->super_Expression,in_EDX);
    (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)pEVar5;
    RefCountedPtr<soul::Structure>::decIfNotNull(local_e0.structure.object);
    goto LAB_001f9813;
  }
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>
                    ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      *)this_00,(TokenType)0x289960);
  if (bVar2) {
    local_f8.category = primitive;
    local_f8.arrayElementCategory = invalid;
    local_f8.isRef = false;
    local_f8.isConstant = false;
    local_f8.primitiveType.type = void_;
    local_f8.boundingSize = 0;
    local_f8.arrayElementBoundingSize = 0;
    local_f8.structure.object = (Structure *)0x0;
    pCVar4 = PoolAllocator::allocate<soul::AST::ConcreteType,soul::AST::Context_const&,soul::Type>
                       (&this_00->allocator->pool,&local_1d0,&local_f8);
    pEVar5 = parseVectorOrArrayTypeSuffixes(this_00,&pCVar4->super_Expression,in_EDX);
    (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)pEVar5;
    RefCountedPtr<soul::Structure>::decIfNotNull(local_f8.structure.object);
    goto LAB_001f9813;
  }
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>
                    ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      *)this_00,(TokenType)0x2ac548);
  if (bVar2) {
    local_110.category = primitive;
    local_110.arrayElementCategory = invalid;
    local_110.isRef = false;
    local_110.isConstant = false;
    local_110.primitiveType.type = int32;
    local_110.boundingSize = 0;
    local_110.arrayElementBoundingSize = 0;
    local_110.structure.object = (Structure *)0x0;
    pCVar4 = PoolAllocator::allocate<soul::AST::ConcreteType,soul::AST::Context_const&,soul::Type>
                       (&this_00->allocator->pool,&local_1d0,&local_110);
    pEVar5 = parseVectorOrArrayTypeSuffixes(this_00,&pCVar4->super_Expression,in_EDX);
    (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)pEVar5;
    RefCountedPtr<soul::Structure>::decIfNotNull(local_110.structure.object);
    goto LAB_001f9813;
  }
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>
                    ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      *)this_00,(TokenType)0x2899ca);
  if (bVar2) {
    local_128.category = primitive;
    local_128.arrayElementCategory = invalid;
    local_128.isRef = false;
    local_128.isConstant = false;
    local_128.primitiveType.type = int32;
    local_128.boundingSize = 0;
    local_128.arrayElementBoundingSize = 0;
    local_128.structure.object = (Structure *)0x0;
    pCVar4 = PoolAllocator::allocate<soul::AST::ConcreteType,soul::AST::Context_const&,soul::Type>
                       (&this_00->allocator->pool,&local_1d0,&local_128);
    pEVar5 = parseVectorOrArrayTypeSuffixes(this_00,&pCVar4->super_Expression,in_EDX);
    (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)pEVar5;
    RefCountedPtr<soul::Structure>::decIfNotNull(local_128.structure.object);
    goto LAB_001f9813;
  }
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>
                    ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      *)this_00,(TokenType)0x2899e0);
  if (bVar2) {
    local_140.category = primitive;
    local_140.arrayElementCategory = invalid;
    local_140.isRef = false;
    local_140.isConstant = false;
    local_140.primitiveType.type = int64;
    local_140.boundingSize = 0;
    local_140.arrayElementBoundingSize = 0;
    local_140.structure.object = (Structure *)0x0;
    pCVar4 = PoolAllocator::allocate<soul::AST::ConcreteType,soul::AST::Context_const&,soul::Type>
                       (&this_00->allocator->pool,&local_1d0,&local_140);
    pEVar5 = parseVectorOrArrayTypeSuffixes(this_00,&pCVar4->super_Expression,in_EDX);
    (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)pEVar5;
    RefCountedPtr<soul::Structure>::decIfNotNull(local_140.structure.object);
    goto LAB_001f9813;
  }
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>
                    ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      *)this_00,(TokenType)0x289a23);
  if (bVar2) {
    local_158.category = primitive;
    local_158.arrayElementCategory = invalid;
    local_158.isRef = false;
    local_158.isConstant = false;
    local_158.primitiveType.type = bool_;
    local_158.boundingSize = 0;
    local_158.arrayElementBoundingSize = 0;
    local_158.structure.object = (Structure *)0x0;
    pCVar4 = PoolAllocator::allocate<soul::AST::ConcreteType,soul::AST::Context_const&,soul::Type>
                       (&this_00->allocator->pool,&local_1d0,&local_158);
    pEVar5 = parseVectorOrArrayTypeSuffixes(this_00,&pCVar4->super_Expression,in_EDX);
    (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)pEVar5;
    RefCountedPtr<soul::Structure>::decIfNotNull(local_158.structure.object);
    goto LAB_001f9813;
  }
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>
                    ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      *)this_00,(TokenType)0x288d3c);
  if (bVar2) {
    local_170.category = primitive;
    local_170.arrayElementCategory = invalid;
    local_170.isRef = false;
    local_170.isConstant = false;
    local_170.primitiveType.type = complex32;
    local_170.boundingSize = 0;
    local_170.arrayElementBoundingSize = 0;
    local_170.structure.object = (Structure *)0x0;
    pCVar4 = PoolAllocator::allocate<soul::AST::ConcreteType,soul::AST::Context_const&,soul::Type>
                       (&this_00->allocator->pool,&local_1d0,&local_170);
    pEVar5 = parseVectorOrArrayTypeSuffixes(this_00,&pCVar4->super_Expression,in_EDX);
    (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)pEVar5;
    RefCountedPtr<soul::Structure>::decIfNotNull(local_170.structure.object);
    goto LAB_001f9813;
  }
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>
                    ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      *)this_00,(TokenType)0x2887f5);
  if (bVar2) {
    local_188.category = primitive;
    local_188.arrayElementCategory = invalid;
    local_188.isRef = false;
    local_188.isConstant = false;
    local_188.primitiveType.type = complex32;
    local_188.boundingSize = 0;
    local_188.arrayElementBoundingSize = 0;
    local_188.structure.object = (Structure *)0x0;
    pCVar4 = PoolAllocator::allocate<soul::AST::ConcreteType,soul::AST::Context_const&,soul::Type>
                       (&this_00->allocator->pool,&local_1d0,&local_188);
    pEVar5 = parseVectorOrArrayTypeSuffixes(this_00,&pCVar4->super_Expression,in_EDX);
    (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)pEVar5;
    RefCountedPtr<soul::Structure>::decIfNotNull(local_188.structure.object);
    goto LAB_001f9813;
  }
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>
                    ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      *)this_00,(TokenType)0x2887ff);
  if (bVar2) {
    local_1a0.category = primitive;
    local_1a0.arrayElementCategory = invalid;
    local_1a0.isRef = false;
    local_1a0.isConstant = false;
    local_1a0.primitiveType.type = complex64;
    local_1a0.boundingSize = 0;
    local_1a0.arrayElementBoundingSize = 0;
    local_1a0.structure.object = (Structure *)0x0;
    pCVar4 = PoolAllocator::allocate<soul::AST::ConcreteType,soul::AST::Context_const&,soul::Type>
                       (&this_00->allocator->pool,&local_1d0,&local_1a0);
    pEVar5 = parseVectorOrArrayTypeSuffixes(this_00,&pCVar4->super_Expression,in_EDX);
    (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)pEVar5;
    RefCountedPtr<soul::Structure>::decIfNotNull(local_1a0.structure.object);
    goto LAB_001f9813;
  }
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>
                    ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      *)this_00,(TokenType)0x289a55);
  if (bVar2) {
    local_1b8.category = stringLiteral;
    local_1b8._1_8_ = 0;
    local_1b8._9_7_ = 0;
    local_1b8.structure.object._0_1_ = 0;
    local_1b8.structure.object._1_7_ = 0;
    pCVar4 = PoolAllocator::allocate<soul::AST::ConcreteType,soul::AST::Context_const&,soul::Type>
                       (&this_00->allocator->pool,&local_1d0,&local_1b8);
    pEVar5 = parseArrayTypeSuffixes(this_00,&pCVar4->super_Expression,in_EDX);
    (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)pEVar5;
    RefCountedPtr<soul::Structure>::decIfNotNull
              ((Structure *)
               CONCAT71(local_1b8.structure.object._1_7_,local_1b8.structure.object._0_1_));
    goto LAB_001f9813;
  }
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>
                    ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      *)this_00,(TokenType)0x2ab00d);
  if (bVar2) {
    if (in_EDX == structMember) {
      CompileMessageHelpers::createMessage<>
                (&local_98,syntax,error,"Struct members cannot be declared const");
      (*(this_00->super_SOULTokeniser)._vptr_Tokeniser[2])(this_00,&local_98);
      CompileMessage::~CompileMessage(&local_98);
    }
    pEVar5 = parseType(this_00,in_EDX);
    local_98.description._M_dataplus._M_p._0_4_ = 2;
    pTVar6 = allocate<soul::AST::TypeMetaFunction,soul::AST::Context&,soul::AST::Expression&,soul::AST::TypeMetaFunction::Op>
                       (this_00,&local_1d0,pEVar5,(Op *)&local_98);
  }
  else {
    bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>
                      ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                        *)this_00,(TokenType)0x2887ef);
    if (bVar2) {
      CompileMessageHelpers::createMessage<char_const(&)[25]>
                (&local_60,(CompileMessageHelpers *)0x1,none,0x289852,"Fixed point type support",
                 in_R9);
      AST::Context::throwError(&local_1d0,&local_60,false);
    }
    pcVar1 = (this_00->super_SOULTokeniser).currentType.text;
    if (pcVar1 != "$identifier") {
      if (pcVar1 != (char *)0x0) {
        iVar3 = strcmp(pcVar1,"$identifier");
        if (iVar3 == 0) goto LAB_001f97a5;
      }
      (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)0x0;
      goto LAB_001f9813;
    }
LAB_001f97a5:
    qi = parseQualifiedIdentifier(this_00);
    op = getOpForTypeMetaFunctionName(qi);
    if (op != none) {
      pcVar1 = (this_00->super_SOULTokeniser).currentType.text;
      if (pcVar1 == "(") {
LAB_001f97f3:
        pTVar6 = parseTypeMetaFunction(this_00,&local_1d0,op);
        pTVar6 = (TypeMetaFunction *)
                 parseVectorOrArrayTypeSuffixes(this_00,&pTVar6->super_Expression,in_EDX);
        goto LAB_001f9810;
      }
      if (pcVar1 != (char *)0x0) {
        iVar3 = strcmp(pcVar1,"(");
        if (iVar3 == 0) goto LAB_001f97f3;
      }
    }
    pTVar6 = (TypeMetaFunction *)
             parseVectorOrArrayTypeSuffixes(this_00,&qi->super_Expression,in_EDX);
  }
LAB_001f9810:
  (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)pTVar6;
LAB_001f9813:
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_1d0.location.sourceCode.object);
  return (pool_ptr<soul::AST::Expression>)(Expression *)this;
}

Assistant:

pool_ptr<AST::Expression> tryParsingType (ParseTypeContext parseContext)
    {
        auto context = getContext();

        if (matchIf (Keyword::float_))    return parseVectorOrArrayTypeSuffixes (createConcreteType (context, PrimitiveType::float32),  parseContext);
        if (matchIf (Keyword::float32))   return parseVectorOrArrayTypeSuffixes (createConcreteType (context, PrimitiveType::float32),  parseContext);
        if (matchIf (Keyword::float64))   return parseVectorOrArrayTypeSuffixes (createConcreteType (context, PrimitiveType::float64),  parseContext);
        if (matchIf (Keyword::void_))     return parseVectorOrArrayTypeSuffixes (createConcreteType (context, PrimitiveType::void_),    parseContext);
        if (matchIf (Keyword::int_))      return parseVectorOrArrayTypeSuffixes (createConcreteType (context, PrimitiveType::int32),    parseContext);
        if (matchIf (Keyword::int32))     return parseVectorOrArrayTypeSuffixes (createConcreteType (context, PrimitiveType::int32),    parseContext);
        if (matchIf (Keyword::int64))     return parseVectorOrArrayTypeSuffixes (createConcreteType (context, PrimitiveType::int64),    parseContext);
        if (matchIf (Keyword::bool_))     return parseVectorOrArrayTypeSuffixes (createConcreteType (context, PrimitiveType::bool_),    parseContext);
        if (matchIf (Keyword::complex))   return parseVectorOrArrayTypeSuffixes (createConcreteType (context, PrimitiveType::complex32),  parseContext);
        if (matchIf (Keyword::complex32)) return parseVectorOrArrayTypeSuffixes (createConcreteType (context, PrimitiveType::complex32),  parseContext);
        if (matchIf (Keyword::complex64)) return parseVectorOrArrayTypeSuffixes (createConcreteType (context, PrimitiveType::complex64),  parseContext);
        if (matchIf (Keyword::string))    return parseArrayTypeSuffixes (createConcreteType (context, Type::createStringLiteral()), parseContext);

        if (matchIf (Keyword::const_))
        {
            if (parseContext == ParseTypeContext::structMember)
                throwError (Errors::memberCannotBeConst());

            auto& type = parseType (parseContext);
            return allocate<AST::TypeMetaFunction> (context, type, AST::TypeMetaFunction::Op::makeConst);
        }

        if (matchIf (Keyword::fixed))
        {
            context.throwError (Errors::notYetImplemented ("Fixed point type support"));
            return parseVectorOrArrayTypeSuffixes (createConcreteType (context, PrimitiveType::fixed), parseContext);
        }

        if (matches (Token::identifier))
        {
            auto& qi = parseQualifiedIdentifier();
            auto metaTypeOp = getOpForTypeMetaFunctionName (qi);

            if (metaTypeOp != AST::TypeMetaFunction::Op::none && matches (Operator::openParen))
                return parseVectorOrArrayTypeSuffixes (parseTypeMetaFunction (context, metaTypeOp), parseContext);

            return parseVectorOrArrayTypeSuffixes (qi, parseContext);
        }

        return {};
    }